

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O2

void Shell::Shuffling::shuffleArray<Lib::DArray<Lib::List<Kernel::Unit*>*>>
               (DArray<Lib::List<Kernel::Unit_*>_*> *a,uint len)

{
  List<Kernel::Unit_*> **ppLVar1;
  List<Kernel::Unit_*> *pLVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  lVar5 = 0;
  uVar6 = (ulong)len;
  while (uVar6 != 0) {
    iVar3 = Lib::Random::getInteger((int)uVar6);
    uVar4 = iVar3 + (int)lVar5;
    ppLVar1 = a->_array;
    pLVar2 = ppLVar1[lVar5];
    ppLVar1[lVar5] = ppLVar1[uVar4];
    ppLVar1[uVar4] = pLVar2;
    lVar5 = lVar5 + 1;
    uVar6 = uVar6 - 1;
  }
  return;
}

Assistant:

static void shuffleArray(Arrayish& a, unsigned len) {
    for(unsigned i=0;i<len;i++){
      unsigned j = Random::getInteger(len-i)+i;
      std::swap(a[i],a[j]);
    }
  }